

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O3

int sort_5_4::merge_sort_1(int *a,int low,int high)

{
  merge_sort_1(a,low,(high + low) / 2);
}

Assistant:

int merge_sort_1(int *a, int low, int high) {
        if (low < high) {
            int mid = (low + high) / 2;
            merge_sort_1(a, low, mid);
            merge_sort_1(a, mid + 1, high);
            merge_1(a, mid, low, high);
        }
    }